

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

t_float slider_getfval(t_slider *x)

{
  double dVar1;
  double dVar2;
  int local_1c;
  int local_18;
  t_float local_14;
  int rounded_val;
  t_float fval;
  t_slider *x_local;
  
  if (((uint)(x->x_gui).x_fsf >> 0x19 & 1) == 0) {
    local_1c = (x->x_val / 100) * 100;
  }
  else {
    local_1c = x->x_val;
  }
  local_18 = local_1c;
  if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && ((x->x_gui).x_snd == (x->x_gui).x_rcv)) {
    local_18 = x->x_val;
  }
  if (x->x_lin0_log1 == 0) {
    dVar2 = (double)local_18 * 0.01 * x->x_k + x->x_min;
  }
  else {
    dVar2 = x->x_min;
    dVar1 = exp(x->x_k * (double)local_18 * 0.01);
    dVar2 = dVar2 * dVar1;
  }
  local_14 = (t_float)dVar2;
  if ((local_14 < 1e-10) && (-1e-10 < local_14)) {
    local_14 = 0.0;
  }
  return local_14;
}

Assistant:

static t_float slider_getfval(t_slider *x)
{
    t_float fval;
    int rounded_val = (x->x_gui.x_fsf.x_finemoved) ? x->x_val : (x->x_val / 100) * 100;

    /* if rcv==snd, don't round the value to prevent bad dragging when zoomed-in */
    if(x->x_gui.x_fsf.x_snd_able && (x->x_gui.x_snd == x->x_gui.x_rcv))
        rounded_val = x->x_val;

    if (x->x_lin0_log1)
        fval = x->x_min * exp(x->x_k * (double)(rounded_val) * 0.01);
    else fval = (double)(rounded_val) * 0.01 * x->x_k + x->x_min;
    if ((fval < 1.0e-10) && (fval > -1.0e-10))
        fval = 0.0;
    return (fval);
}